

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_class_effect(parser *p)

{
  void *pvVar1;
  long lVar2;
  effect *effect_00;
  effect *new_effect;
  effect *effect;
  class_spell *spell;
  class_book *book;
  player_class *c;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (*(int *)((long)pvVar1 + 0x108) < 1) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    if ((*(long *)((long)pvVar1 + 0x110) == 0) ||
       (class_max_books < *(wchar_t *)((long)pvVar1 + 0x108))) {
      __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                    ,0xfc5,"enum parser_error parse_class_effect(struct parser *)");
    }
    lVar2 = *(long *)((long)pvVar1 + 0x110) + (long)(*(int *)((long)pvVar1 + 0x108) + -1) * 0x20;
    if (*(int *)(lVar2 + 0xc) < 1) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      if ((*(long *)(lVar2 + 0x18) == 0) || (book_max_spells < *(wchar_t *)(lVar2 + 0xc))) {
        __assert_fail("book->spells && book->num_spells <= book_max_spells",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                      ,0xfcb,"enum parser_error parse_class_effect(struct parser *)");
      }
      lVar2 = *(long *)(lVar2 + 0x18) + (long)(*(int *)(lVar2 + 0xc) + -1) * 0x38;
      effect_00 = (effect *)mem_zalloc(0x38);
      if (*(long *)(lVar2 + 0x10) == 0) {
        *(effect **)(lVar2 + 0x10) = effect_00;
      }
      else {
        for (new_effect = *(effect **)(lVar2 + 0x10); new_effect->next != (effect *)0x0;
            new_effect = new_effect->next) {
        }
        new_effect->next = effect_00;
      }
      p_local._4_4_ = grab_effect_data(p,effect_00);
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_class_effect(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct class_book *book;
	struct class_spell *spell;
	struct effect *effect, *new_effect;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.
		 */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	book = &c->magic.books[c->magic.num_books - 1];
	if (book->num_spells < 1) {
		/* Missing a spell directive after the book directive. */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(book->spells && book->num_spells <= book_max_spells);
	spell = &book->spells[book->num_spells - 1];
	/* Go to the next vacant effect and set it to the new one  */
	new_effect = mem_zalloc(sizeof(*effect));
	if (spell->effect) {
		effect = spell->effect;
		while (effect->next) effect = effect->next;
		effect->next = new_effect;
	} else {
		spell->effect = new_effect;
	}
	/* Fill in the detail */
	return grab_effect_data(p, new_effect);
}